

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpresponseparser.h
# Opt level: O2

ParseResult __thiscall
httpparser::HttpResponseParser::consume
          (HttpResponseParser *this,Response *resp,char *begin,char *end)

{
  size_t *psVar1;
  byte bVar2;
  pointer pHVar3;
  State SVar4;
  __normal_iterator<httpparser::Response::HeaderItem_*,_std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>_>
  _Var5;
  size_t sVar6;
  char cVar7;
  int iVar8;
  bool bVar9;
  HeaderItem local_a8;
  string *local_68;
  vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
  *local_60;
  char *local_58;
  string *local_50;
  vector<char,_std::allocator<char>_> *local_48;
  Response *local_40;
  byte local_31 [8];
  char input;
  
  local_48 = &resp->content;
  local_68 = &this->chunkSizeStr;
  local_60 = &resp->headers;
  local_50 = &resp->status;
  local_40 = resp;
  do {
    if (begin == end) {
      return ParsingIncompleted;
    }
    bVar2 = *begin;
    iVar8 = (int)(char)bVar2;
    cVar7 = (char)local_50;
    local_31[0] = bVar2;
    switch(this->state) {
    case ResponseStatusStart:
      if (bVar2 != 0x48) {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_ht;
      break;
    case ResponseHttpVersion_ht:
      if (bVar2 != 0x54) {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_htt;
      break;
    case ResponseHttpVersion_htt:
      if (bVar2 != 0x54) {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_http;
      break;
    case ResponseHttpVersion_http:
      if (bVar2 != 0x50) {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_slash;
      break;
    case ResponseHttpVersion_slash:
      if (bVar2 != 0x2f) {
        return ParsingError;
      }
      resp->versionMajor = 0;
      resp->versionMinor = 0;
      this->state = ResponseHttpVersion_majorStart;
      break;
    case ResponseHttpVersion_majorStart:
      if (9 < iVar8 - 0x30U) {
        return ParsingError;
      }
      resp->versionMajor = iVar8 - 0x30U;
      this->state = ResponseHttpVersion_major;
      break;
    case ResponseHttpVersion_major:
      if (bVar2 == 0x2e) {
        this->state = ResponseHttpVersion_minorStart;
      }
      else {
        if (9 < iVar8 - 0x30U) {
          return ParsingError;
        }
        resp->versionMajor = (iVar8 - 0x30U) + resp->versionMajor * 10;
      }
      break;
    case ResponseHttpVersion_minorStart:
      if (9 < iVar8 - 0x30U) {
        return ParsingError;
      }
      resp->versionMinor = iVar8 - 0x30U;
      this->state = ResponseHttpVersion_minor;
      break;
    case ResponseHttpVersion_minor:
      if (bVar2 == 0x20) {
        this->state = ResponseHttpVersion_statusCodeStart;
        resp->statusCode = 0;
      }
      else {
        if (9 < iVar8 - 0x30U) {
          return ParsingError;
        }
        resp->versionMinor = (iVar8 - 0x30U) + resp->versionMinor * 10;
      }
      break;
    case ResponseHttpVersion_statusCodeStart:
      if (9 < iVar8 - 0x30U) {
        return ParsingError;
      }
      resp->statusCode = iVar8 - 0x30U;
      this->state = ResponseHttpVersion_statusCode;
      break;
    case ResponseHttpVersion_statusCode:
      if (iVar8 - 0x30U < 10) {
        resp->statusCode = (iVar8 - 0x30U) + resp->statusCode * 10;
      }
      else {
        if (899 < resp->statusCode - 100) {
          return ParsingError;
        }
        if (bVar2 != 0x20) {
          return ParsingError;
        }
        this->state = ResponseHttpVersion_statusTextStart;
      }
      break;
    case ResponseHttpVersion_statusTextStart:
      if ((char)bVar2 < '\0') {
        return ParsingError;
      }
      std::__cxx11::string::push_back(cVar7);
      this->state = ResponseHttpVersion_statusText;
      resp = local_40;
      break;
    case ResponseHttpVersion_statusText:
      if (bVar2 == 0xd) {
        this->state = ResponseHttpVersion_newLine;
      }
      else {
        if ((char)bVar2 < '\0') {
          return ParsingError;
        }
LAB_00107dea:
        std::__cxx11::string::push_back(cVar7);
        resp = local_40;
      }
      break;
    case ResponseHttpVersion_newLine:
    case ExpectingNewline_2:
      if (bVar2 != 10) {
        return ParsingError;
      }
      this->state = HeaderLineStart;
      break;
    case HeaderLineStart:
      if (bVar2 == 0xd) {
        this->state = ExpectingNewline_3;
      }
      else if (((resp->headers).
                super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (resp->headers).
                super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                ._M_impl.super__Vector_impl_data._M_finish) || ((bVar2 != 0x20 && (bVar2 != 9)))) {
        if ((char)bVar2 < '\0') {
          return ParsingError;
        }
        if (bVar2 < 0x20) {
          return ParsingError;
        }
        if (bVar2 == 0x7f) {
          return ParsingError;
        }
        bVar9 = isSpecial(this,iVar8);
        if (bVar9) {
          return ParsingError;
        }
        local_a8.name._M_dataplus._M_p = (pointer)&local_a8.name.field_2;
        local_a8.value.field_2._8_8_ = 0;
        local_a8.value._M_string_length = 0;
        local_a8.name.field_2._M_allocated_capacity = 0;
        local_a8.name.field_2._8_8_ = 0;
        local_a8.name._M_string_length = 0;
        local_a8.value._M_dataplus._M_p = (pointer)&local_a8.value.field_2;
        local_a8.value.field_2._M_allocated_capacity = 0;
        std::
        vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
        ::emplace_back<httpparser::Response::HeaderItem>(local_60,&local_a8);
        Response::HeaderItem::~HeaderItem(&local_a8);
        resp = local_40;
        std::__cxx11::string::reserve
                  ((ulong)((local_40->headers).
                           super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1));
        std::__cxx11::string::reserve
                  ((ulong)&(resp->headers).
                           super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].value);
        std::__cxx11::string::push_back
                  ((char)(resp->headers).
                         super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -0x40);
        this->state = HeaderName;
      }
      else {
        this->state = HeaderLws;
      }
      break;
    case HeaderLws:
      if ((bVar2 != 9) && (bVar2 != 0x20)) {
        if (bVar2 != 0xd) {
          if (bVar2 < 0x20) {
            return ParsingError;
          }
          if (bVar2 == 0x7f) {
            return ParsingError;
          }
          this->state = HeaderValue;
          goto LAB_00107de2;
        }
        this->state = ExpectingNewline_2;
      }
      break;
    case HeaderName:
      if (bVar2 == 0x3a) {
        this->state = SpaceBeforeHeaderValue;
      }
      else {
        if ((char)bVar2 < '\0') {
          return ParsingError;
        }
        if (bVar2 < 0x20) {
          return ParsingError;
        }
        if (bVar2 == 0x7f) {
          return ParsingError;
        }
        bVar9 = isSpecial(this,iVar8);
        resp = local_40;
        if (bVar9) {
          return ParsingError;
        }
        std::__cxx11::string::push_back
                  ((char)(local_40->headers).
                         super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -0x40);
      }
      break;
    case SpaceBeforeHeaderValue:
      if (bVar2 != 0x20) {
        return ParsingError;
      }
      this->state = HeaderValue;
      break;
    case HeaderValue:
      if (bVar2 != 0xd) {
        if (bVar2 < 0x20) {
          return ParsingError;
        }
        if (bVar2 == 0x7f) {
          return ParsingError;
        }
LAB_00107de2:
        cVar7 = (char)(resp->headers).
                      super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -0x20;
        goto LAB_00107dea;
      }
      pHVar3 = (resp->headers).
               super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = pHVar3[-1].name._M_dataplus._M_p;
      iVar8 = strcasecmp(local_58,"Content-Length");
      if (iVar8 == 0) {
        iVar8 = atoi(pHVar3[-1].value._M_dataplus._M_p);
        this->contentSize = (long)iVar8;
        std::vector<char,_std::allocator<char>_>::reserve(local_48,(long)iVar8);
      }
      else {
        iVar8 = strcasecmp(local_58,"Transfer-Encoding");
        if ((iVar8 == 0) &&
           (iVar8 = strcasecmp(pHVar3[-1].value._M_dataplus._M_p,"chunked"), iVar8 == 0)) {
          this->chunked = true;
        }
      }
      this->state = ExpectingNewline_2;
      resp = local_40;
      break;
    case ExpectingNewline_3:
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<httpparser::Response::HeaderItem*,std::vector<httpparser::Response::HeaderItem,std::allocator<httpparser::Response::HeaderItem>>>,__gnu_cxx::__ops::_Iter_pred<bool(*)(httpparser::Response::HeaderItem_const&)>>
                        ((resp->headers).
                         super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (local_40->headers).
                         super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish,checkIfConnection);
      if (_Var5._M_current ==
          (local_40->headers).
          super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar9 = true;
        if ((1 < local_40->versionMajor) ||
           ((local_40->versionMajor == 1 && (local_40->versionMinor == 1)))) goto LAB_00107cbb;
      }
      else {
        iVar8 = strcasecmp(((_Var5._M_current)->value)._M_dataplus._M_p,"Keep-Alive");
        bVar9 = iVar8 == 0;
LAB_00107cbb:
        local_40->keepAlive = bVar9;
      }
      if (this->chunked == false) {
        if (this->contentSize == 0) {
LAB_00107e54:
          return (uint)(local_31[0] != 10) * 2;
        }
        SVar4 = Post;
      }
      else {
        SVar4 = ChunkSize;
      }
      this->state = SVar4;
      resp = local_40;
      break;
    case Post:
      this->contentSize = this->contentSize - 1;
      std::vector<char,_std::allocator<char>_>::push_back(local_48,(value_type *)local_31);
      resp = local_40;
      if (this->contentSize == 0) {
        return ParsingCompleted;
      }
      break;
    case ChunkSize:
      iVar8 = isalnum(iVar8);
      if (iVar8 != 0) {
        cVar7 = (char)local_68;
        goto LAB_00107dea;
      }
      resp = local_40;
      if (bVar2 == 0xd) {
        this->state = ChunkSizeNewLine;
      }
      else {
        if (bVar2 != 0x3b) {
          return ParsingError;
        }
        this->state = ChunkExtensionName;
      }
      break;
    case ChunkExtensionName:
      iVar8 = isalnum(iVar8);
      resp = local_40;
      if (bVar2 != 0x20 && iVar8 == 0) {
        if (bVar2 == 0xd) goto LAB_00107b1e;
        if (bVar2 != 0x3d) {
          return ParsingError;
        }
        this->state = ChunkExtensionValue;
      }
      break;
    case ChunkExtensionValue:
    case ChunkTrailerValue:
      iVar8 = isalnum(iVar8);
      resp = local_40;
      if (bVar2 != 0x20 && iVar8 == 0) {
        if (bVar2 != 0xd) {
          return ParsingError;
        }
LAB_00107b1e:
        this->state = ChunkSizeNewLine;
        resp = local_40;
      }
      break;
    case ChunkSizeNewLine:
      if (bVar2 != 10) {
        return ParsingError;
      }
      sVar6 = strtol((this->chunkSizeStr)._M_dataplus._M_p,(char **)0x0,0x10);
      this->chunkSize = sVar6;
      (this->chunkSizeStr)._M_string_length = 0;
      *(this->chunkSizeStr)._M_dataplus._M_p = '\0';
      std::vector<char,_std::allocator<char>_>::reserve
                (local_48,(size_type)
                          ((resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                          (this->chunkSize -
                          (long)(resp->content).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start)));
      resp = local_40;
      if (this->chunkSize == 0) {
        this->state = ChunkSizeNewLine_2;
      }
      else {
        this->state = ChunkData;
      }
      break;
    case ChunkSizeNewLine_2:
      if (bVar2 == 0xd) {
        this->state = ChunkSizeNewLine_3;
      }
      else {
        iVar8 = isalpha(iVar8);
        if (iVar8 == 0) {
          return ParsingError;
        }
        this->state = ChunkTrailerName;
        resp = local_40;
      }
      break;
    case ChunkSizeNewLine_3:
      goto LAB_00107e54;
    case ChunkTrailerName:
      iVar8 = isalnum(iVar8);
      resp = local_40;
      if (iVar8 == 0) {
        if (bVar2 != 0x3a) {
          return ParsingError;
        }
        this->state = ChunkTrailerValue;
      }
      break;
    case ChunkDataNewLine_1:
      if (bVar2 != 0xd) {
        return ParsingError;
      }
      this->state = ChunkDataNewLine_2;
      break;
    case ChunkDataNewLine_2:
      if (bVar2 != 10) {
        return ParsingError;
      }
      this->state = ChunkSize;
      break;
    case ChunkData:
      std::vector<char,_std::allocator<char>_>::push_back(local_48,(value_type *)local_31);
      psVar1 = &this->chunkSize;
      *psVar1 = *psVar1 - 1;
      resp = local_40;
      if (*psVar1 == 0) {
        this->state = ChunkDataNewLine_1;
      }
      break;
    default:
      return ParsingError;
    }
    begin = (char *)((byte *)begin + 1);
  } while( true );
}

Assistant:

ParseResult consume(Response &resp, const char *begin, const char *end)
    {
        while( begin != end )
        {
            char input = *begin++;

            switch (state)
            {
            case ResponseStatusStart:
                if( input != 'H' )
                {
                    return ParsingError;
                }
                else
                {
                    state = ResponseHttpVersion_ht;
                }
                break;
            case ResponseHttpVersion_ht:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_htt;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_htt:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_http;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_http:
                if( input == 'P' )
                {
                    state = ResponseHttpVersion_slash;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_slash:
                if( input == '/' )
                {
                    resp.versionMajor = 0;
                    resp.versionMinor = 0;
                    state = ResponseHttpVersion_majorStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_majorStart:
                if( isDigit(input) )
                {
                    resp.versionMajor = input - '0';
                    state = ResponseHttpVersion_major;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_major:
                if( input == '.' )
                {
                    state = ResponseHttpVersion_minorStart;
                }
                else if( isDigit(input) )
                {
                    resp.versionMajor = resp.versionMajor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minorStart:
                if( isDigit(input) )
                {
                    resp.versionMinor = input - '0';
                    state = ResponseHttpVersion_minor;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minor:
                if( input == ' ')
                {
                    state = ResponseHttpVersion_statusCodeStart;
                    resp.statusCode = 0;
                }
                else if( isDigit(input) )
                {
                    resp.versionMinor = resp.versionMinor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCodeStart:
                if( isDigit(input) )
                {
                    resp.statusCode = input - '0';
                    state = ResponseHttpVersion_statusCode;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCode:
                if( isDigit(input) )
                {
                    resp.statusCode = resp.statusCode * 10 + input - '0';
                }
                else
                {
                    if( resp.statusCode < 100 || resp.statusCode > 999 )
                    {
                        return ParsingError;
                    }
                    else if( input == ' ' )
                    {
                        state = ResponseHttpVersion_statusTextStart;
                    }
                    else
                    {
                        return ParsingError;
                    }
                }
                break;
            case ResponseHttpVersion_statusTextStart:
                if( isChar(input) )
                {
                    resp.status += input;
                    state = ResponseHttpVersion_statusText;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusText:
                if( input == '\r' )
                {
                    state = ResponseHttpVersion_newLine;
                }
                else if( isChar(input) )
                {
                    resp.status += input;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_newLine:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderLineStart:
                if( input == '\r' )
                {
                    state = ExpectingNewline_3;
                }
                else if( !resp.headers.empty() && (input == ' ' || input == '\t') )
                {
                    state = HeaderLws;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.push_back(Response::HeaderItem());
                    resp.headers.back().name.reserve(16);
                    resp.headers.back().value.reserve(16);
                    resp.headers.back().name.push_back(input);
                    state = HeaderName;
                }
                break;
            case HeaderLws:
                if( input == '\r' )
                {
                    state = ExpectingNewline_2;
                }
                else if( input == ' ' || input == '\t' )
                {
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    state = HeaderValue;
                    resp.headers.back().value.push_back(input);
                }
                break;
            case HeaderName:
                if( input == ':' )
                {
                    state = SpaceBeforeHeaderValue;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().name.push_back(input);
                }
                break;
            case SpaceBeforeHeaderValue:
                if( input == ' ' )
                {
                    state = HeaderValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderValue:
                if( input == '\r' )
                {
                    Response::HeaderItem &h = resp.headers.back();

                    if( strcasecmp(h.name.c_str(), "Content-Length") == 0 )
                    {
                        contentSize = atoi(h.value.c_str());
                        resp.content.reserve( contentSize );
                    }
                    else if( strcasecmp(h.name.c_str(), "Transfer-Encoding") == 0 )
                    {
                        if(strcasecmp(h.value.c_str(), "chunked") == 0)
                            chunked = true;
                    }
                    state = ExpectingNewline_2;
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().value.push_back(input);
                }
                break;
            case ExpectingNewline_2:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ExpectingNewline_3: {
                std::vector<Response::HeaderItem>::iterator it = std::find_if(resp.headers.begin(),
                                                                    resp.headers.end(),
                                                                    checkIfConnection);

                if( it != resp.headers.end() )
                {
                    if( strcasecmp(it->value.c_str(), "Keep-Alive") == 0 )
                    {
                        resp.keepAlive = true;
                    }
                    else  // == Close
                    {
                        resp.keepAlive = false;
                    }
                }
                else
                {
                    if( resp.versionMajor > 1 || (resp.versionMajor == 1 && resp.versionMinor == 1) )
                        resp.keepAlive = true;
                }

                if( chunked )
                {
                    state = ChunkSize;
                }
                else if( contentSize == 0 )
                {
                    if( input == '\n')
                        return ParsingCompleted;
                    else
                        return ParsingError;
                }

                else
                {
                    state = Post;
                }
                break;
            }
            case Post:
                --contentSize;
                resp.content.push_back(input);

                if( contentSize == 0 )
                {
                    return ParsingCompleted;
                }
                break;
            case ChunkSize:
                if( isalnum(input) )
                {
                    chunkSizeStr.push_back(input);
                }
                else if( input == ';' )
                {
                    state = ChunkExtensionName;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionName:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '=' )
                {
                    state = ChunkExtensionValue;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine:
                if( input == '\n' )
                {
                    chunkSize = strtol(chunkSizeStr.c_str(), NULL, 16);
                    chunkSizeStr.clear();
                    resp.content.reserve(resp.content.size() + chunkSize);

                    if( chunkSize == 0 )
                        state = ChunkSizeNewLine_2;
                    else
                        state = ChunkData;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_2:
                if( input == '\r' )
                {
                    state = ChunkSizeNewLine_3;
                }
                else if( isalpha(input) )
                {
                    state = ChunkTrailerName;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_3:
                if( input == '\n' )
                {
                    return ParsingCompleted;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerName:
                if( isalnum(input) )
                {
                    // skip
                }
                else if( input == ':' )
                {
                    state = ChunkTrailerValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkData:
                resp.content.push_back(input);

                if( --chunkSize == 0 )
                {
                    state = ChunkDataNewLine_1;
                }
                break;
            case ChunkDataNewLine_1:
                if( input == '\r' )
                {
                    state = ChunkDataNewLine_2;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkDataNewLine_2:
                if( input == '\n' )
                {
                    state = ChunkSize;
                }
                else
                {
                    return ParsingError;
                }
                break;
            default:
                return ParsingError;
            }
        }

        return ParsingIncompleted;
    }